

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

VkFormat vk::mapCompressedTextureFormat(CompressedTexFormat format)

{
  InternalError *this;
  VkFormat local_c;
  CompressedTexFormat format_local;
  
  switch(format) {
  case COMPRESSEDTEXFORMAT_EAC_R11:
    local_c = VK_FORMAT_EAC_R11_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:
    local_c = VK_FORMAT_EAC_R11_SNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_EAC_RG11:
    local_c = VK_FORMAT_EAC_R11G11_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:
    local_c = VK_FORMAT_EAC_R11G11_SNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_RGB8:
    local_c = VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_SRGB8:
    local_c = VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:
    local_c = VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:
    local_c = VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:
    local_c = VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:
    local_c = VK_FORMAT_ASTC_4x4_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:
    local_c = VK_FORMAT_ASTC_5x4_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:
    local_c = VK_FORMAT_ASTC_5x5_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:
    local_c = VK_FORMAT_ASTC_6x5_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:
    local_c = VK_FORMAT_ASTC_6x6_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:
    local_c = VK_FORMAT_ASTC_8x5_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:
    local_c = VK_FORMAT_ASTC_8x6_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:
    local_c = VK_FORMAT_ASTC_8x8_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:
    local_c = VK_FORMAT_ASTC_10x5_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:
    local_c = VK_FORMAT_ASTC_10x6_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:
    local_c = VK_FORMAT_ASTC_10x8_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:
    local_c = VK_FORMAT_ASTC_10x10_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:
    local_c = VK_FORMAT_ASTC_12x10_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:
    local_c = VK_FORMAT_ASTC_12x12_UNORM_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_4x4_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_5x4_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_5x5_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_6x5_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_6x6_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_8x5_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_8x6_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_8x8_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_10x5_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_10x6_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_10x8_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_10x10_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_12x10_SRGB_BLOCK;
    break;
  case COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:
    local_c = VK_FORMAT_ASTC_12x12_SRGB_BLOCK;
    break;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Unknown texture format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
               ,0x185);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return local_c;
}

Assistant:

VkFormat mapCompressedTextureFormat (const tcu::CompressedTexFormat format)
{
	// update this mapping if CompressedTexFormat changes
	DE_STATIC_ASSERT(tcu::COMPRESSEDTEXFORMAT_LAST == 39);

	switch (format)
	{
		case tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8:						return VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8:						return VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:	return VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:	return VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:					return VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:			return VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK;

		case tcu::COMPRESSEDTEXFORMAT_EAC_R11:							return VK_FORMAT_EAC_R11_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:					return VK_FORMAT_EAC_R11_SNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_EAC_RG11:							return VK_FORMAT_EAC_R11G11_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:					return VK_FORMAT_EAC_R11G11_SNORM_BLOCK;

		case tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:					return VK_FORMAT_ASTC_4x4_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_4x4_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:					return VK_FORMAT_ASTC_5x4_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_5x4_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:					return VK_FORMAT_ASTC_5x5_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_5x5_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:					return VK_FORMAT_ASTC_6x5_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_6x5_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:					return VK_FORMAT_ASTC_6x6_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_6x6_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:					return VK_FORMAT_ASTC_8x5_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_8x5_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:					return VK_FORMAT_ASTC_8x6_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_8x6_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:					return VK_FORMAT_ASTC_8x8_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_8x8_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:					return VK_FORMAT_ASTC_10x5_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_10x5_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:					return VK_FORMAT_ASTC_10x6_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_10x6_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:					return VK_FORMAT_ASTC_10x8_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_10x8_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:					return VK_FORMAT_ASTC_10x10_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_10x10_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:					return VK_FORMAT_ASTC_12x10_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_12x10_SRGB_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:					return VK_FORMAT_ASTC_12x12_UNORM_BLOCK;
		case tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:			return VK_FORMAT_ASTC_12x12_SRGB_BLOCK;

		default:
			TCU_THROW(InternalError, "Unknown texture format");
			return VK_FORMAT_UNDEFINED;
	}
}